

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartsBupOutputter.cpp
# Opt level: O2

void __thiscall
PartsBupOutputter::newMouth
          (PartsBupOutputter *this,Image *img,Point pos,int num,
          vector<MaskRect,_std::allocator<MaskRect>_> *mask)

{
  Blend BVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__source;
  allocator<char> local_c1;
  string local_c0;
  path local_a0;
  path local_78;
  string local_50;
  
  std::operator+(&local_a0._M_pathname,
                 &this->baseName + ((this->withFaceName)._M_string_length != 0),"_");
  std::__cxx11::to_string(&local_c0,num);
  std::operator+(&local_78._M_pathname,&local_a0._M_pathname,&local_c0);
  std::__cxx11::string::operator=((string *)&this->withMouthName,(string *)&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  this->mouthPos = pos;
  BVar1 = prepareImageInTmp(this,img,pos,mask,&this->withFace);
  this->mouthBlend = BVar1;
  std::operator+(&local_c0,&this->withMouthName,".png");
  std::filesystem::__cxx11::u8path<std::__cxx11::string,std::filesystem::__cxx11::path,char>
            (&local_a0,(__cxx11 *)&local_c0,__source);
  std::filesystem::__cxx11::operator/(&local_78,&this->partsPath,&local_a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_c1);
  Image::writePNG(&this->tmp,&local_78,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::filesystem::__cxx11::path::~path(&local_78);
  std::filesystem::__cxx11::path::~path(&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  return;
}

Assistant:

void newMouth(const Image& img, Point pos, int num, const std::vector<MaskRect>& mask) override {
		withMouthName = (withFaceName.empty() ? baseName : withFaceName) + "_" + std::to_string(num);
		mouthPos = pos;
		mouthBlend = prepareImageInTmp(img, pos, mask, withFace);
		tmp.writePNG(partsPath/fs::u8path(withMouthName + ".png"));
	}